

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

unique_ptr<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>_> __thiscall
KDIS::NETWORK::Connection::GetNextPDU(Connection *this,KString *SenderIp)

{
  long *plVar1;
  ConnectionSubscriber *pCVar2;
  bool bVar3;
  bool bVar4;
  KUINT16 KVar5;
  KUINT16 KVar6;
  int iVar7;
  ulong uVar8;
  pointer pHVar9;
  reference ppCVar10;
  Header6 *this_00;
  string *in_RDX;
  exception *e;
  __normal_iterator<KDIS::NETWORK::ConnectionSubscriber_**,_std::vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>_>
  local_2068;
  iterator itrEnd_1;
  iterator itr_1;
  iterator iStack_2040;
  KUINT16 currentPos;
  iterator itrEnd;
  iterator itr;
  KOCTET local_2028 [4];
  KINT32 iSz;
  KOCTET Buffer [8192];
  KString *SenderIp_local;
  Connection *this_local;
  unique_ptr<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>_> *pdu;
  
  KVar5 = KDataStream::GetBufferSize((KDataStream *)(SenderIp + 4));
  if ((KVar5 == 0) &&
     (iVar7 = (**(code **)(*(long *)SenderIp + 0x80))
                        (SenderIp,local_2028,0x2000,&SenderIp[5]._M_string_length), iVar7 != 0)) {
    itrEnd = std::
             vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
             ::begin((vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
                      *)(SenderIp + 3));
    iStack_2040 = std::
                  vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
                  ::end((vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
                         *)(SenderIp + 3));
    while (bVar4 = __gnu_cxx::operator!=(&itrEnd,&stack0xffffffffffffdfc0), bVar4) {
      ppCVar10 = __gnu_cxx::
                 __normal_iterator<KDIS::NETWORK::ConnectionSubscriber_**,_std::vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>_>
                 ::operator*(&itrEnd);
      uVar8 = (**(code **)(*(long *)*ppCVar10 + 0x10))
                        (*ppCVar10,local_2028,iVar7,&SenderIp[5]._M_string_length);
      if ((uVar8 & 1) == 0) {
        std::unique_ptr<KDIS::PDU::Header7,std::default_delete<KDIS::PDU::Header7>>::
        unique_ptr<std::default_delete<KDIS::PDU::Header7>,void>
                  ((unique_ptr<KDIS::PDU::Header7,std::default_delete<KDIS::PDU::Header7>> *)this);
        return (__uniq_ptr_data<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>,_true,_true>
                )(__uniq_ptr_data<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>,_true,_true>
                  )this;
      }
      __gnu_cxx::
      __normal_iterator<KDIS::NETWORK::ConnectionSubscriber_**,_std::vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>_>
      ::operator++(&itrEnd);
    }
    KDataStream::Clear((KDataStream *)(SenderIp + 4));
    KDataStream::CopyFromBuffer((KDataStream *)(SenderIp + 4),local_2028,(KUINT16)iVar7,Big_Endian);
  }
  KVar5 = KDataStream::GetBufferSize((KDataStream *)(SenderIp + 4));
  if (KVar5 != 0) {
    if (in_RDX != (string *)0x0) {
      std::__cxx11::string::operator=(in_RDX,(string *)&SenderIp[5]._M_string_length);
    }
    KVar5 = KDataStream::GetCurrentWritePosition((KDataStream *)(SenderIp + 4));
    bVar4 = false;
    plVar1 = *(long **)((long)&SenderIp[3].field_2 + 8);
    (**(code **)(*plVar1 + 8))(this,plVar1,(KDataStream *)(SenderIp + 4));
    pHVar9 = std::unique_ptr<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>_>::get
                       ((unique_ptr<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>_> *)
                        this);
    if (pHVar9 == (pointer)0x0) {
      KDataStream::Clear((KDataStream *)(SenderIp + 4));
      bVar3 = false;
    }
    else {
      itrEnd_1 = std::
                 vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
                 ::begin((vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
                          *)(SenderIp + 3));
      local_2068._M_current =
           (ConnectionSubscriber **)
           std::
           vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
           ::end((vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
                  *)(SenderIp + 3));
      while (bVar4 = __gnu_cxx::operator!=(&itrEnd_1,&local_2068), bVar4) {
        ppCVar10 = __gnu_cxx::
                   __normal_iterator<KDIS::NETWORK::ConnectionSubscriber_**,_std::vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>_>
                   ::operator*(&itrEnd_1);
        pCVar2 = *ppCVar10;
        pHVar9 = std::unique_ptr<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>_>::get
                           ((unique_ptr<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>_>
                             *)this);
        (**(code **)(*(long *)pCVar2 + 0x18))(pCVar2,pHVar9);
        __gnu_cxx::
        __normal_iterator<KDIS::NETWORK::ConnectionSubscriber_**,_std::vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>_>
        ::operator++(&itrEnd_1);
      }
      this_00 = &std::unique_ptr<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>_>::
                 operator->((unique_ptr<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>_>
                             *)this)->super_Header6;
      KVar6 = PDU::Header6::GetPDULength(this_00);
      KDataStream::SetCurrentWritePosition((KDataStream *)(SenderIp + 4),KVar5 + KVar6);
      bVar4 = true;
      bVar3 = true;
    }
    if (!bVar4) {
      std::unique_ptr<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>_>::~unique_ptr
                ((unique_ptr<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>_> *)this);
    }
    if (bVar3) {
      return (__uniq_ptr_data<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>,_true,_true>
              )(__uniq_ptr_data<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>,_true,_true>
                )this;
    }
  }
  std::unique_ptr<KDIS::PDU::Header7,std::default_delete<KDIS::PDU::Header7>>::
  unique_ptr<std::default_delete<KDIS::PDU::Header7>,void>
            ((unique_ptr<KDIS::PDU::Header7,std::default_delete<KDIS::PDU::Header7>> *)this);
  return (__uniq_ptr_data<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>,_true,_true>)
         (__uniq_ptr_data<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>,_true,_true>)
         this;
}

Assistant:

unique_ptr<Header> Connection::GetNextPDU(KString *SenderIp /* = 0 */ ) noexcept(false)
{
    // Are we currently dealing with a PDU Bundle, if so then dont read any new data.
    if( m_stream.GetBufferSize() == 0 )
    {
        // Get some new data from the network
        // Create a buffer to store network data
        KOCTET Buffer[MAX_PDU_SIZE];
        KINT32 iSz = Receive( Buffer, MAX_PDU_SIZE, &m_sLastIP );

        if( iSz )
        {
            // Fire the first event, this event can also be used to inform us if we should stop
            vector<ConnectionSubscriber*>::iterator itr = m_vpSubscribers.begin();
            vector<ConnectionSubscriber*>::iterator itrEnd = m_vpSubscribers.end();
            for( ; itr != itrEnd; ++itr )
            {
                if( !( *itr )->OnDataReceived( Buffer, iSz, m_sLastIP ) )
                {
                    // We should quit
                    return unique_ptr<Header>();
                }
            }

            // Create a new data stream
            m_stream.Clear();
            m_stream.CopyFromBuffer( Buffer, iSz );
        }
    }

    // Now process the stream
    if( m_stream.GetBufferSize() > 0 )
    {
        // Do they want the IP address returned?
        if( SenderIp )
        {
            *SenderIp = m_sLastIP;
        }

        // Get the current write position
        KUINT16 currentPos = m_stream.GetCurrentWritePosition();

        try
        {
            // Get the next/only PDU from the stream
            unique_ptr<Header> pdu = m_pPduFact->Decode( m_stream );

            // If the PDU was decoded successfully then fire the next event
            if( pdu.get() )
            {
                vector<ConnectionSubscriber*>::iterator itr = m_vpSubscribers.begin();
                vector<ConnectionSubscriber*>::iterator itrEnd = m_vpSubscribers.end();
                for( ; itr != itrEnd; ++itr )
                {
                    ( *itr )->OnPDUReceived( pdu.get() );
                }

                // Set the write pos for the next pdu. We do this here as its possible that when the PDU was decoded that some data may
				// have been left un-decoded so to be extra safe we use the reported pdu size and not the current stream.
                m_stream.SetCurrentWritePosition( currentPos + pdu->GetPDULength() );

                // Now return the decoded pdu
                return pdu;
            }
            else
            {
                // If a PDU could not be decoded in the PDU bundle, then we need to throw
                // out the whole stream. There is no way to know where the next PDU might start
                // in the data stream.
                m_stream.Clear();
            }
        }
        catch( const exception & e )
        {
            // Something went wrong, the stream is likely corrupted now so wipe it or we will have issues in the next GetNextPDU call.
            m_stream.Clear();
            throw;
        }
    }

    return unique_ptr<Header>(); // No data so Null ptr
}